

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::BVC_RL(CPU *this)

{
  uint8_t uVar1;
  
  this->cycles = 2;
  uVar1 = GetByte(this);
  if (((this->field_6).ps & 0x40) != 0) {
    uVar1 = '\0';
  }
  this->pc = this->pc + (short)(char)uVar1;
  return;
}

Assistant:

void CPU::BVC_RL()
{
    cycles = 2;
    uint8_t offset = GetByte();
    pc += (!V) ? static_cast<int8_t>(offset) : 0;
}